

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O2

nhr_response nhr_response_create(void *received,size_t received_len)

{
  nhr_response r;
  
  r = (nhr_response)nhr_malloc_zero(0x28);
  nhr_response_parse_status_code(r,(char *)received);
  if (r->status_code != 0) {
    nhr_response_parse_content_length(r,(char *)received);
    nhr_response_parse_transfer_encoding(r,(char *)received);
    nhr_response_parse_content_encoding(r,(char *)received);
    nhr_response_parse_body(r,(char *)received,received_len);
  }
  nhr_response_check_is_finished(r);
  return r;
}

Assistant:

nhr_response nhr_response_create(void * received, const size_t received_len) {
	struct nhr_response_struct * r = (struct nhr_response_struct *)nhr_malloc_zero(sizeof(struct nhr_response_struct));

	nhr_response_parse_status_code(r, received);

	if (r->status_code != 0) {
		nhr_response_parse_content_length(r, received);
		nhr_response_parse_transfer_encoding(r, received);
		nhr_response_parse_content_encoding(r, received);
		nhr_response_parse_body(r, received, received_len);
	}
	nhr_response_check_is_finished(r);
	return r;
}